

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase69::run(TestCase69 *this)

{
  Builder builder_00;
  Reader reader_00;
  Orphanage orphanage;
  undefined8 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined1 auStack_2d8 [8];
  ReaderFor<capnproto_test::capnp::test::TestDefaults> structReader;
  ArrayPtr<const_char> local_298;
  undefined1 local_288 [8];
  Orphan<capnproto_test::capnp::test::TestDefaults> orphan;
  MallocMessageBuilder reader;
  undefined1 local_150 [8];
  String text;
  TextCodec codec;
  Builder local_128;
  undefined1 local_100 [8];
  MallocMessageBuilder builder;
  TestCase69 *this_local;
  
  builder.moreSegments.builder.disposer = (ArrayDisposer *)this;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_100,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestDefaults>
            (&local_128,(MessageBuilder *)local_100);
  builder_00._builder.capTable = (CapTableBuilder *)local_128._builder.data;
  builder_00._builder.segment = (SegmentBuilder *)local_128._builder.capTable;
  builder_00._builder.data = local_128._builder.pointers;
  builder_00._builder.pointers = (WirePointer *)local_128._builder._32_8_;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffcd0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x30);
  initTestMessage(builder_00);
  TextCodec::TextCodec((TextCodec *)((long)&text.content.disposer + 3));
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestDefaults>
            ((Builder *)&reader.moreSegments.builder.disposer,(MessageBuilder *)local_100);
  TextCodec::encode<capnproto_test::capnp::test::TestDefaults::Builder>
            ((String *)local_150,(TextCodec *)((long)&text.content.disposer + 3),
             (Builder *)&reader.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&orphan.builder.location,0x400,GROW_HEURISTICALLY);
  kj::StringPtr::StringPtr((StringPtr *)&local_298,(String *)local_150);
  orphanage = MessageBuilder::getOrphanage((MessageBuilder *)&orphan.builder.location);
  structReader._reader._40_8_ = orphanage.arena;
  TextCodec::decode<capnproto_test::capnp::test::TestDefaults>
            ((Orphan<capnproto_test::capnp::test::TestDefaults> *)local_288,
             (TextCodec *)((long)&text.content.disposer + 3),(StringPtr)local_298,orphanage);
  Orphan<capnproto_test::capnp::test::TestDefaults>::getReader
            ((ReaderFor<capnproto_test::capnp::test::TestDefaults> *)auStack_2d8,
             (Orphan<capnproto_test::capnp::test::TestDefaults> *)local_288);
  reader_00._reader.capTable = structReader._reader.capTable;
  reader_00._reader.segment = structReader._reader.segment;
  reader_00._reader.data = structReader._reader.data;
  reader_00._reader.pointers = structReader._reader.pointers;
  reader_00._reader.dataSize = structReader._reader.dataSize;
  reader_00._reader.pointerCount = structReader._reader.pointerCount;
  reader_00._reader._38_2_ = structReader._reader._38_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffcd8;
  checkTestMessage(reader_00);
  Orphan<capnproto_test::capnp::test::TestDefaults>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestDefaults> *)local_288);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&orphan.builder.location);
  kj::String::~String((String *)local_150);
  TextCodec::~TextCodec((TextCodec *)((long)&text.content.disposer + 3));
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_100);
  return;
}

Assistant:

TEST(DynamicApi, Defaults) {
  AlignedData<1> nullRoot = {{0, 0, 0, 0, 0, 0, 0, 0}};
  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(nullRoot.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));
  auto root = reader.getRoot<DynamicStruct>(Schema::from<TestDefaults>());
  checkDynamicTestMessage(root);
}